

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument_factory.hpp
# Opt level: O0

void __thiscall
boost::runtime::
argument_factory<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_true>
::produce_argument(argument_factory<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_true>
                   *this,cstring *source,cstring *param_name,arguments_store *store)

{
  undefined1 uVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RCX;
  basic_cstring<const_char> *in_RDX;
  basic_cstring<const_char> *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *values;
  cstring *in_stack_000000c8;
  arguments_store *in_stack_000000d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  cstring *in_stack_fffffffffffffee8;
  value_type *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  basic_cstring<const_char> *this_00;
  basic_cstring<const_char> *this_01;
  basic_cstring<const_char> *s;
  basic_cstring<const_char> local_c8 [3];
  basic_cstring<const_char> local_98;
  value_type *local_88;
  basic_cstring<const_char> local_70;
  basic_cstring<const_char> local_60;
  basic_cstring<const_char> local_50;
  string local_40 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  
  this_00 = &local_50;
  s = in_RDX;
  local_20 = in_RCX;
  unit_test::basic_cstring<const_char>::basic_cstring(this_00,in_RDX);
  this_01 = &local_60;
  unit_test::basic_cstring<const_char>::basic_cstring(this_01,in_RSI);
  value_interpreter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ::interpret((value_interpreter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               *)s,this_01,this_00);
  unit_test::basic_cstring<const_char>::basic_cstring(&local_70,s);
  uVar1 = arguments_store::has
                    ((arguments_store *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  if ((bool)uVar1) {
    unit_test::basic_cstring<const_char>::basic_cstring(&local_98,s);
    local_88 = (value_type *)
               arguments_store::
               get<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                         (in_stack_000000d0,in_stack_000000c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_20,local_88);
  }
  else {
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x270ace);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_RDX,CONCAT17(uVar1,in_stack_fffffffffffffef8),in_stack_fffffffffffffef0,
             (allocator_type *)in_stack_fffffffffffffee8);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x270af6);
    unit_test::basic_cstring<const_char>::basic_cstring(local_c8,s);
    arguments_store::set<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((arguments_store *)this_01,this_00,in_RDI);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffef0);
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void        produce_argument( cstring source, cstring param_name, arguments_store& store ) const
    {
        ValueType value = m_interpreter.interpret( param_name, source );

        if( store.has( param_name ) ) {
            std::vector<ValueType>& values = store.get<std::vector<ValueType> >( param_name );
            values.push_back( value );
        }
        else {
            std::vector<ValueType> values( 1, value );

            store.set( param_name, values );
        }

    }